

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void pbrt::InitLogging(LogLevel level,bool useGPU)

{
  LOGGING_LogLevel = level;
  if (level != Invalid) {
    return;
  }
  ErrorExit<>("Invalid --log-level specified.");
}

Assistant:

void InitLogging(LogLevel level, bool useGPU) {
    LOGGING_LogLevel = level;

    if (level == LogLevel::Invalid)
        ErrorExit("Invalid --log-level specified.");

#ifdef PBRT_BUILD_GPU_RENDERER
    if (useGPU)
        CUDA_CHECK(cudaMemcpyToSymbol(LOGGING_LogLevelGPU, &LOGGING_LogLevel,
                                      sizeof(LOGGING_LogLevel)));
#endif
}